

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int oldParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 *puVar4;
  long lVar5;
  char *pcVar6;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr doc;
  uint uVar7;
  char *filename_00;
  int iStack_64;
  char *pcStack_60;
  char *pcStack_58;
  long lStack_50;
  
  nb_tests = nb_tests + 1;
  puVar4 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar4 = 0;
  lVar5 = xmlParseFile(filename);
  puVar4 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar4 = 1;
  uVar7 = 1;
  if (lVar5 != 0) {
    filename_00 = temp_directory;
    pcVar6 = resultFilename(filename,temp_directory,".res");
    if (pcVar6 == (char *)0x0) {
      oldParseTest_cold_1();
      nb_tests = nb_tests + 1;
      pcStack_58 = result;
      lStack_50 = lVar5;
      iVar1 = loadMem(filename,&pcStack_60,&iStack_64);
      if (iVar1 == 0) {
        ctxt = (xmlParserCtxtPtr)xmlNewParserCtxt();
        pcVar6 = pcStack_60;
        doc = (xmlDocPtr)xmlCtxtReadMemory(ctxt,pcStack_60,iStack_64,filename,0,options | 0x40);
        free(pcVar6);
        if (doc == (xmlDocPtr)0x0) {
          iVar1 = 1;
        }
        else {
          xmlDocDumpMemory(doc,&pcStack_60,&iStack_64);
          iVar1 = compareFileMem(filename_00,pcStack_60,iStack_64);
          iVar2 = 0;
          if ((pcStack_60 == (char *)0x0) || (iVar1 != 0)) {
            fprintf(_stderr,"Result for %s failed in %s\n",filename,filename_00);
            iVar2 = -1;
          }
          iVar3 = testParseContent(ctxt,doc,filename);
          iVar1 = -1;
          if (-1 < iVar3) {
            iVar1 = iVar2;
          }
          xmlFreeDoc(doc);
          xmlFreeParserCtxt(ctxt);
          (*_xmlFree)(pcStack_60);
        }
      }
      else {
        fprintf(_stderr,"Failed to load %s\n",filename);
        iVar1 = -1;
      }
      return iVar1;
    }
    xmlSaveFile(pcVar6,lVar5);
    iVar1 = compareFiles(pcVar6,result);
    xmlFreeDoc(lVar5);
    puVar4 = (undefined4 *)__xmlGetWarningsDefaultValue();
    *puVar4 = 0;
    lVar5 = xmlParseFile(pcVar6);
    puVar4 = (undefined4 *)__xmlGetWarningsDefaultValue();
    *puVar4 = 1;
    if (lVar5 != 0) {
      xmlSaveFile(pcVar6,lVar5);
      iVar2 = compareFiles(pcVar6,result);
      uVar7 = (uint)(iVar2 != 0 || iVar1 != 0);
      xmlFreeDoc(lVar5);
      unlink(pcVar6);
      free(pcVar6);
    }
  }
  return uVar7;
}

Assistant:

static int
oldParseTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED,
	     int options ATTRIBUTE_UNUSED) {
    xmlDocPtr doc;
    char *temp;
    int res = 0;

    nb_tests++;
    /*
     * base of the test, parse with the old API
     */
#ifdef LIBXML_SAX1_ENABLED
    xmlGetWarningsDefaultValue = 0;
    doc = xmlParseFile(filename);
    xmlGetWarningsDefaultValue = 1;
#else
    doc = xmlReadFile(filename, NULL, XML_PARSE_NOWARNING);
#endif
    if (doc == NULL)
        return(1);
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "out of memory\n");
        fatalError();
    }
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    /*
     * Parse the saved result to make sure the round trip is okay
     */
#ifdef LIBXML_SAX1_ENABLED
    xmlGetWarningsDefaultValue = 0;
    doc = xmlParseFile(temp);
    xmlGetWarningsDefaultValue = 1;
#else
    doc = xmlReadFile(temp, NULL, XML_PARSE_NOWARNING);
#endif
    if (doc == NULL)
        return(1);
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(res);
}